

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_line_aa_basics.cpp
# Opt level: O2

void agg::bisectrix(line_parameters *l1,line_parameters *l2,int *x,int *y)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  
  iVar4 = (int)*(undefined8 *)(l2 + 8);
  iVar1 = (int)((ulong)*(undefined8 *)(l2 + 8) >> 0x20);
  iVar9 = (int)*(undefined8 *)l2;
  iVar3 = (int)((ulong)*(undefined8 *)l2 >> 0x20);
  iVar8 = (int)((ulong)*(undefined8 *)l1 >> 0x20);
  dVar10 = (double)(iVar9 - (int)*(undefined8 *)l1);
  dVar11 = (double)(iVar3 - iVar8);
  dVar6 = (double)iVar4 - ((double)*(int *)(l2 + 0x28) / (double)*(int *)(l1 + 0x28)) * dVar10;
  dVar7 = (double)iVar1 - ((double)*(int *)(l2 + 0x28) / (double)*(int *)(l1 + 0x28)) * dVar11;
  if (dVar11 * (double)(iVar4 - iVar9) < (double)(iVar1 - iVar3) * dVar10 + 100.0) {
    dVar10 = dVar6 - (double)iVar9;
    dVar11 = dVar7 - (double)iVar3;
    dVar6 = dVar6 - (dVar10 + dVar10);
    dVar7 = dVar7 - (dVar11 + dVar11);
  }
  dVar10 = dVar6 - (double)iVar9;
  dVar11 = dVar7 - (double)iVar3;
  if ((int)SQRT(dVar10 * dVar10 + dVar11 * dVar11) < 0x100) {
    *x = (iVar9 * 2 - iVar8) + iVar1 >> 1;
    iVar4 = (*(int *)(l2 + 4) * 2 + *(int *)l1) - *(int *)(l2 + 8) >> 1;
  }
  else {
    auVar2._8_8_ = -(ulong)(dVar7 < 0.0);
    auVar2._0_8_ = -(ulong)(dVar6 < 0.0);
    uVar5 = movmskpd(iVar1,auVar2);
    dVar10 = -0.5;
    dVar11 = -0.5;
    if ((uVar5 & 1) == 0) {
      dVar11 = 0.5;
    }
    *x = (int)(dVar11 + dVar6);
    if ((uVar5 & 2) == 0) {
      dVar10 = 0.5;
    }
    iVar4 = (int)(dVar7 + dVar10);
  }
  *y = iVar4;
  return;
}

Assistant:

void bisectrix(const line_parameters& l1, 
                   const line_parameters& l2, 
                   int* x, int* y)
    {
        double k = double(l2.len) / double(l1.len);
        double tx = l2.x2 - (l2.x1 - l1.x1) * k;
        double ty = l2.y2 - (l2.y1 - l1.y1) * k;

        //All bisectrices must be on the right of the line
        //If the next point is on the left (l1 => l2.2)
        //then the bisectix should be rotated by 180 degrees.
        if(double(l2.x2 - l2.x1) * double(l2.y1 - l1.y1) <
           double(l2.y2 - l2.y1) * double(l2.x1 - l1.x1) + 100.0)
        {
            tx -= (tx - l2.x1) * 2.0;
            ty -= (ty - l2.y1) * 2.0;
        }

        // Check if the bisectrix is too short
        double dx = tx - l2.x1;
        double dy = ty - l2.y1;
        if((int)sqrt(dx * dx + dy * dy) < line_subpixel_scale)
        {
            *x = (l2.x1 + l2.x1 + (l2.y1 - l1.y1) + (l2.y2 - l2.y1)) >> 1;
            *y = (l2.y1 + l2.y1 - (l2.x1 - l1.x1) - (l2.x2 - l2.x1)) >> 1;
            return;
        }
        *x = iround(tx);
        *y = iround(ty);
    }